

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS ref_metric_synchronize(REF_GRID to_grid)

{
  REF_INTERP ref_interp;
  REF_ADJ pRVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  
  ref_interp = to_grid->interp;
  uVar2 = 0;
  if (ref_interp != (REF_INTERP)0x0) {
    if (ref_interp->ref_mpi->n < 2) {
      lVar4 = (long)to_grid->node->max;
      uVar2 = 0;
      if (0 < lVar4) {
        lVar5 = 0;
        do {
          if ((((-1 < to_grid->node->global[lVar5]) &&
               (pRVar1 = to_grid->cell[3]->ref_adj, lVar5 < pRVar1->nnode)) &&
              (pRVar1->first[lVar5] != -1)) &&
             (((pRVar1 = to_grid->cell[8]->ref_adj, lVar5 < pRVar1->nnode &&
               (pRVar1->first[lVar5] != -1)) && (ref_interp->cell[lVar5] == -1)))) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x2c8,"ref_metric_synchronize","should be located");
            return 1;
          }
          lVar5 = lVar5 + 1;
        } while (lVar4 != lVar5);
        uVar2 = 0;
      }
    }
    else {
      uVar2 = ref_interp_locate_warm(ref_interp);
      if (uVar2 == 0) {
        uVar3 = ref_metric_interpolate(ref_interp);
        uVar2 = 0;
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x2c2,"ref_metric_synchronize",(ulong)uVar3,"interp");
          uVar2 = uVar3;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x2c1,"ref_metric_synchronize",(ulong)uVar2,"map from existing");
      }
    }
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_metric_synchronize(REF_GRID to_grid) {
  REF_INTERP ref_interp = ref_grid_interp(to_grid);
  REF_MPI ref_mpi;
  REF_INT node;
  REF_DBL max_error, tol = 1.0e-8;
  REF_BOOL report_interp_error = REF_FALSE;

  if (NULL == ref_interp) return REF_SUCCESS;

  ref_mpi = ref_interp_mpi(ref_interp);

  if (ref_mpi_para(ref_mpi)) {
    /* parallel can miss on partition boundaries, refresh interp */
    RSS(ref_interp_locate_warm(ref_interp), "map from existing");
    RSS(ref_metric_interpolate(ref_interp), "interp");
  } else {
    /* sequential should always localized unless mixed, assert */
    each_ref_node_valid_node(ref_grid_node(to_grid), node) {
      if (!ref_cell_node_empty(ref_grid_tri(to_grid), node) &&
          !ref_cell_node_empty(ref_grid_tet(to_grid), node)) {
        RUS(REF_EMPTY, ref_interp_cell(ref_interp, node), "should be located");
      }
    }
  }

  if (report_interp_error) {
    RSS(ref_interp_max_error(ref_interp, &max_error), "err");
    if (max_error > tol && ref_mpi_once(ref_mpi)) {
      printf("warning: %e max_error greater than %e tol\n", max_error, tol);
    }
  }

  return REF_SUCCESS;
}